

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::TransformNode::calculateStatistics(TransformNode *this,Statistics *stat)

{
  long in_RSI;
  long in_RDI;
  
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 1;
  if (*(long *)(in_RDI + 0x50) == 1) {
    (**(code **)(**(long **)(in_RDI + 0x98) + 0x48))(*(long **)(in_RDI + 0x98),in_RSI);
    *(long *)(in_RSI + 0x90) = *(long *)(in_RSI + 0x90) + 1;
    if (*(long *)(*(long *)(in_RDI + 0x98) + 0x50) == 1) {
      *(long *)(in_RSI + 0x98) = *(long *)(in_RSI + 0x98) + 1;
    }
    if (1 < *(ulong *)(in_RDI + 0x78)) {
      (**(code **)(**(long **)(in_RDI + 0x98) + 0x48))(*(long **)(in_RDI + 0x98),in_RSI);
    }
  }
  return;
}

Assistant:

void SceneGraph::TransformNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1)
    {
      child->calculateStatistics(stat);
      
      stat.numTransformNodes++;
      if (child->indegree == 1)
        stat.numTransformedObjects++;
      
      if (spaces.size() > 1) child->calculateStatistics(stat); // break instance up when motion blur is used
    }
  }